

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall cnn::Model::~Model(Model *this)

{
  bool bVar1;
  iterator this_00;
  reference ppPVar2;
  __normal_iterator<cnn::ParametersBase_**,_std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>_>
  *in_RDI;
  ParametersBase *p;
  iterator __end1;
  iterator __begin1;
  vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_> *__range1;
  vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_> *in_stack_ffffffffffffffc8;
  __normal_iterator<cnn::ParametersBase_**,_std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (ParametersBase **)
       std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>::begin
                 (in_stack_ffffffffffffffc8);
  this_00 = std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>::end
                      (in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<cnn::ParametersBase_**,_std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>_>
                               *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppPVar2 = __gnu_cxx::
              __normal_iterator<cnn::ParametersBase_**,_std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>_>
              ::operator*(local_18);
    in_stack_ffffffffffffffc8 =
         (vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_> *)*ppPVar2;
    if (in_stack_ffffffffffffffc8 !=
        (vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_> *)0x0) {
      (*(code *)(in_stack_ffffffffffffffc8->
                super__Vector_base<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>).
                _M_impl.super__Vector_impl_data._M_start[5])();
    }
    __gnu_cxx::
    __normal_iterator<cnn::ParametersBase_**,_std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>_>
    ::operator++(local_18);
  }
  std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>::~vector
            ((vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *)
             this_00._M_current);
  std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::~vector
            ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)this_00._M_current);
  std::vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_>::~vector
            ((vector<cnn::ParametersBase_*,_std::allocator<cnn::ParametersBase_*>_> *)
             this_00._M_current);
  return;
}

Assistant:

Model::~Model() {
  for (auto p : all_params) delete p;
}